

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderingUtils.hpp
# Opt level: O0

void __thiscall
Kernel::MultiSet<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::MultiSet
          (MultiSet<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *this,
          Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *elems)

{
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar1;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *in_RSI;
  IntegerConstantType n;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> elem;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *iter;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *r;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *l;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *local_28;
  
  l = in_RSI;
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::size(in_RSI);
  Lib::
  Stack<std::tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>_>
  ::Stack((Stack<std::tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>_>
           *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
          (size_t)in_stack_ffffffffffffff38);
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::begin(in_RSI);
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::end(in_RSI);
  std::sort<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>*>
            ((Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
             CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),in_stack_ffffffffffffff38
            );
  local_28 = Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::begin
                       (in_RSI);
  while( true ) {
    r = local_28;
    pMVar1 = Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::end
                       (in_RSI);
    if (r == pMVar1) break;
    Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Monom
              ((Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
               CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff38);
    IntegerConstantType::IntegerConstantType
              ((IntegerConstantType *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
               (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    while( true ) {
      local_28 = local_28 + 1;
      in_stack_ffffffffffffff38 = local_28;
      pMVar1 = Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::end
                         (in_RSI);
      in_stack_ffffffffffffff47 = false;
      if (in_stack_ffffffffffffff38 != pMVar1) {
        in_stack_ffffffffffffff37 =
             Kernel::operator==((Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)l,r);
        in_stack_ffffffffffffff47 = in_stack_ffffffffffffff37;
      }
      if ((bool)in_stack_ffffffffffffff47 == false) break;
      IntegerConstantType::operator++
                ((IntegerConstantType *)
                 CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
    }
    std::
    make_tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>&,Kernel::IntegerConstantType&>
              (in_stack_ffffffffffffff38,
               (IntegerConstantType *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30))
    ;
    Lib::
    Stack<std::tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>_>
    ::push((Stack<std::tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>_>
            *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
           (tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
            *)in_stack_ffffffffffffff38);
    std::
    tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
    ::~tuple((tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
              *)0x8e5630);
    IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x8e563d);
    Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::~Monom
              ((Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x8e564a);
  }
  return;
}

Assistant:

MultiSet(Stack<T> elems) 
      : _elems(elems.size()) 
    {
      std::sort(elems.begin(), elems.end());
      auto iter = elems.begin();
      while (iter != elems.end()) {
        auto elem = *iter++;
        auto n = IntegerConstantType(1);
        while (iter != elems.end() && *iter == elem) {
          ++n;
          iter++;
        }
        _elems.push(std::make_tuple(elem, n));
      }
    }